

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

vector<efsw::String,_std::allocator<efsw::String>_> *
efsw::String::split(vector<efsw::String,_std::allocator<efsw::String>_> *__return_storage_ptr__,
                   String *str,Uint32 *splitchar,bool *pushEmptyString)

{
  char32_t __c;
  ulong uVar1;
  String tmpstr;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_70;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<efsw::String,_std::allocator<efsw::String>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<efsw::String,_std::allocator<efsw::String>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<efsw::String,_std::allocator<efsw::String>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  String((String *)&local_70);
  for (uVar1 = 0; uVar1 < (str->mString)._M_string_length; uVar1 = uVar1 + 1) {
    __c = (str->mString)._M_dataplus._M_p[uVar1];
    if (__c == *splitchar) {
      if ((*pushEmptyString != false) || (local_70._M_string_length != 0)) {
        std::vector<efsw::String,_std::allocator<efsw::String>_>::push_back
                  (__return_storage_ptr__,(value_type *)&local_70);
        String((String *)&local_50,"");
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_assign(&local_70,&local_50);
        std::__cxx11::u32string::~u32string((u32string *)&local_50);
      }
    }
    else {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_70,__c);
    }
  }
  if (local_70._M_string_length != 0) {
    std::vector<efsw::String,_std::allocator<efsw::String>_>::push_back
              (__return_storage_ptr__,(value_type *)&local_70);
  }
  std::__cxx11::u32string::~u32string((u32string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<String> String::split( const String& str, const Uint32& splitchar,
								   const bool& pushEmptyString ) {
	std::vector<String> tmp;
	String tmpstr;

	for ( size_t i = 0; i < str.size(); i++ ) {
		if ( str[i] == splitchar ) {
			if ( pushEmptyString || tmpstr.size() ) {
				tmp.push_back( tmpstr );
				tmpstr = "";
			}
		} else {
			tmpstr += str[i];
		}
	}

	if ( tmpstr.size() ) {
		tmp.push_back( tmpstr );
	}

	return tmp;
}